

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_greedy_extDict_row
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  int *iEnd;
  long *plVar1;
  undefined8 *puVar2;
  U32 UVar3;
  U32 *pUVar4;
  seqDef *psVar5;
  undefined8 uVar6;
  int iVar7;
  uint uVar8;
  size_t sVar9;
  BYTE *pBVar10;
  int iVar11;
  BYTE *pBVar12;
  int *mEnd;
  int *piVar13;
  uint uVar14;
  U32 UVar15;
  ulong uVar16;
  long lVar17;
  int *ip;
  U32 maxDistance;
  ulong uVar18;
  int *ip_00;
  uint local_d8;
  uint local_d4;
  size_t ofbCandidate;
  seqStore_t *local_c8;
  uint local_c0;
  uint local_bc;
  int *local_b8;
  BYTE *local_b0;
  uint local_a4;
  int *local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  BYTE *local_80;
  int *local_78;
  BYTE *local_70;
  ulong local_68;
  int *local_60;
  int local_58;
  uint local_54;
  int *local_50;
  size_t local_48;
  BYTE *local_40;
  U32 *local_38;
  
  local_b0 = (ms->window).base;
  local_70 = (ms->window).dictBase;
  local_98 = (ulong)(ms->window).dictLimit;
  local_50 = (int *)(local_70 + local_98);
  local_40 = local_70 + (ms->window).lowLimit;
  local_90 = CONCAT44(local_90._4_4_,(ms->cParams).windowLog);
  local_a4 = (ms->cParams).minMatch;
  if (5 < local_a4) {
    local_a4 = 6;
  }
  if (local_a4 < 5) {
    local_a4 = 4;
  }
  local_bc = (ms->cParams).searchLog;
  local_c0 = 6;
  if (local_bc < 6) {
    local_c0 = local_bc;
  }
  if (local_c0 < 5) {
    local_c0 = 4;
  }
  local_d4 = *rep;
  local_d8 = rep[1];
  ms->lazySkipping = 0;
  local_80 = local_b0 + local_98;
  ip_00 = (int *)((ulong)(local_80 == (BYTE *)src) + (long)src);
  local_60 = (int *)((long)src + (srcSize - 0x10));
  uVar18 = (ulong)ms->nextToUpdate;
  uVar14 = ((int)local_60 - (int)(local_b0 + uVar18)) + 1;
  if (7 < uVar14) {
    uVar14 = 8;
  }
  uVar8 = 0;
  if (local_b0 + uVar18 <= local_60) {
    uVar8 = uVar14;
  }
  iEnd = (int *)((long)src + srcSize);
  local_68 = (ulong)(uVar8 + ms->nextToUpdate);
  UVar3 = ms->rowHashLog;
  local_88 = (ulong)(0x38 - UVar3);
  local_b8 = (int *)CONCAT44(local_b8._4_4_,0x18 - UVar3);
  local_48 = 1L << ((byte)local_c0 & 0x3f);
  local_a0 = (int *)CONCAT44(local_a0._4_4_,UVar3 + 8);
  pUVar4 = ms->hashTable;
  pBVar10 = ms->tagTable;
  local_c8 = seqStore;
  local_78 = (int *)src;
  local_38 = rep;
  for (; uVar18 < local_68; uVar18 = uVar18 + 1) {
    if (0x20 < (uint)local_a0) {
LAB_0018c4b1:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x4741,"size_t ZSTD_hashPtrSalted(const void *, U32, U32, const U64)");
    }
    plVar1 = (long *)(local_b0 + uVar18);
    uVar16 = ms->hashSalt;
    if (local_a4 == 5) {
      sVar9 = (*plVar1 * -0x30e4432345000000 ^ uVar16) >> ((byte)local_88 & 0x3f);
    }
    else if (local_a4 == 6) {
      sVar9 = ZSTD_hash6PtrS(plVar1,(uint)local_a0,uVar16);
    }
    else {
      sVar9 = (size_t)(((int)*plVar1 * -0x61c8864f ^ (uint)uVar16) >> ((byte)local_b8 & 0x1f));
    }
    uVar14 = ((uint)(sVar9 >> 8) & 0xffffff) << ((byte)local_c0 & 0x1f);
    if (((ulong)(pUVar4 + uVar14) & 0x3f) != 0) {
LAB_0018c4d0:
      __assert_fail("ZSTD_isAligned(hashTable + relRow, 64)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x76a2,
                    "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
    }
    iVar7 = ZSTD_isAligned(pBVar10 + uVar14,local_48);
    if (iVar7 == 0) {
LAB_0018c4ef:
      __assert_fail("ZSTD_isAligned(tagTable + relRow, (size_t)1 << rowLog)",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x76a3,
                    "void ZSTD_row_prefetch(const U32 *, const BYTE *, const U32, const U32)");
    }
    ms->hashCache[(uint)uVar18 & 7] = (U32)sVar9;
  }
  uVar14 = 1 << ((byte)local_90 & 0x1f);
  iVar7 = (int)local_98 + -1;
  local_a0 = iEnd + -8;
  piVar13 = local_a0;
  ip = local_78;
LAB_0018bdaa:
  do {
    if (local_60 <= ip_00) {
      *local_38 = local_d4;
      local_38[1] = local_d8;
      return (long)iEnd - (long)ip;
    }
    iVar11 = ((int)ip_00 - (int)local_b0) + 1;
    UVar3 = (ms->window).lowLimit;
    UVar15 = iVar11 - uVar14;
    if (iVar11 - UVar3 <= uVar14) {
      UVar15 = UVar3;
    }
    if (ms->loadedDictEnd != 0) {
      UVar15 = UVar3;
    }
    uVar8 = iVar11 - local_d4;
    if ((2 < iVar7 - uVar8) && (local_d4 <= iVar11 - UVar15)) {
      pBVar10 = local_b0;
      if (uVar8 < (uint)local_98) {
        pBVar10 = local_70;
      }
      if (*(int *)((long)ip_00 + 1) != *(int *)(pBVar10 + uVar8)) goto LAB_0018be13;
      mEnd = iEnd;
      if (uVar8 < (uint)local_98) {
        mEnd = local_50;
      }
      local_b8 = (int *)((long)ip_00 + 1);
      sVar9 = ZSTD_count_2segments
                        ((BYTE *)((long)ip_00 + 5),pBVar10 + (ulong)uVar8 + 4,(BYTE *)iEnd,
                         (BYTE *)mEnd,local_80);
      uVar18 = sVar9 + 4;
      sVar9 = 1;
      ip_00 = local_b8;
LAB_0018bfe2:
      if (local_c8->maxNbSeq <=
          (ulong)((long)local_c8->sequences - (long)local_c8->sequencesStart >> 3)) {
LAB_0018c50e:
        __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468b,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0x20000 < local_c8->maxNbLit) {
LAB_0018c56b:
        __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468d,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      uVar16 = (long)ip_00 - (long)ip;
      pBVar10 = local_c8->lit;
      if (local_c8->litStart + local_c8->maxNbLit < pBVar10 + uVar16) {
LAB_0018c58a:
        __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468e,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (iEnd < ip_00) {
LAB_0018c54c:
        __assert_fail("literals + litLength <= litLimit",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x468f,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      local_b8 = ip_00;
      local_90 = uVar18;
      if (piVar13 < ip_00) {
        ZSTD_safecopyLiterals(pBVar10,(BYTE *)ip,(BYTE *)ip_00,(BYTE *)piVar13);
LAB_0018c058:
        local_c8->lit = local_c8->lit + uVar16;
        if (0xffff < uVar16) {
          if (local_c8->longLengthType != ZSTD_llt_none) {
            __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x46a0,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
          local_c8->longLengthType = ZSTD_llt_literalLength;
          local_c8->longLengthPos =
               (U32)((ulong)((long)local_c8->sequences - (long)local_c8->sequencesStart) >> 3);
        }
      }
      else {
        uVar6 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar10 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar10 + 8) = uVar6;
        pBVar10 = local_c8->lit;
        if (0x10 < uVar16) {
          if ((BYTE *)0xffffffffffffffe0 < pBVar10 + 0x10 + (-0x10 - (long)(ip + 4))) {
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                          ,0x36a6,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          uVar6 = *(undefined8 *)(ip + 6);
          *(undefined8 *)(pBVar10 + 0x10) = *(undefined8 *)(ip + 4);
          *(undefined8 *)(pBVar10 + 0x18) = uVar6;
          if (0x20 < (long)uVar16) {
            lVar17 = 0;
            do {
              puVar2 = (undefined8 *)((long)ip + lVar17 + 0x20);
              uVar6 = puVar2[1];
              pBVar12 = pBVar10 + lVar17 + 0x20;
              *(undefined8 *)pBVar12 = *puVar2;
              *(undefined8 *)(pBVar12 + 8) = uVar6;
              puVar2 = (undefined8 *)((long)ip + lVar17 + 0x30);
              uVar6 = puVar2[1];
              *(undefined8 *)(pBVar12 + 0x10) = *puVar2;
              *(undefined8 *)(pBVar12 + 0x18) = uVar6;
              lVar17 = lVar17 + 0x20;
            } while (pBVar12 + 0x20 < pBVar10 + uVar16);
          }
          goto LAB_0018c058;
        }
        local_c8->lit = pBVar10 + uVar16;
      }
      psVar5 = local_c8->sequences;
      psVar5->litLength = (U16)uVar16;
      psVar5->offBase = (U32)sVar9;
      if (local_90 < 3) {
LAB_0018c52d:
        __assert_fail("matchLength >= MINMATCH",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x46aa,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      if (0xffff < local_90 - 3) {
        if (local_c8->longLengthType != ZSTD_llt_none) {
LAB_0018c5a9:
          __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                        "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                        ,0x46ad,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        local_c8->longLengthType = ZSTD_llt_matchLength;
        local_c8->longLengthPos = (U32)((ulong)((long)psVar5 - (long)local_c8->sequencesStart) >> 3)
        ;
      }
      psVar5->mlBase = (U16)(local_90 - 3);
      local_c8->sequences = psVar5 + 1;
      if (ms->lazySkipping != 0) {
        uVar18 = (ulong)ms->nextToUpdate;
        UVar3 = ms->rowHashLog;
        uVar8 = ((int)local_60 - (int)(local_b0 + uVar18)) + 1;
        if (7 < uVar8) {
          uVar8 = 8;
        }
        if (local_60 < local_b0 + uVar18) {
          uVar8 = 0;
        }
        pUVar4 = ms->hashTable;
        pBVar10 = ms->tagTable;
        local_68 = (ulong)(uVar8 + ms->nextToUpdate);
        local_78 = (int *)(ulong)(0x38 - UVar3);
        local_88 = CONCAT44(local_88._4_4_,0x18 - UVar3);
        local_58 = iVar7;
        local_54 = uVar14;
        for (; uVar18 < local_68; uVar18 = uVar18 + 1) {
          if (0x20 < UVar3 + 8) goto LAB_0018c4b1;
          plVar1 = (long *)(local_b0 + uVar18);
          uVar16 = ms->hashSalt;
          if (local_a4 == 5) {
            sVar9 = (*plVar1 * -0x30e4432345000000 ^ uVar16) >> ((byte)local_78 & 0x3f);
          }
          else if (local_a4 == 6) {
            sVar9 = ZSTD_hash6PtrS(plVar1,UVar3 + 8,uVar16);
          }
          else {
            sVar9 = (size_t)(((int)*plVar1 * -0x61c8864f ^ (uint)uVar16) >> ((byte)local_88 & 0x1f))
            ;
          }
          uVar14 = ((uint)(sVar9 >> 8) & 0xffffff) << ((byte)local_c0 & 0x1f);
          if (((ulong)(pUVar4 + uVar14) & 0x3f) != 0) goto LAB_0018c4d0;
          iVar7 = ZSTD_isAligned(pBVar10 + uVar14,local_48);
          if (iVar7 == 0) goto LAB_0018c4ef;
          ms->hashCache[(uint)uVar18 & 7] = (U32)sVar9;
        }
        ms->lazySkipping = 0;
        piVar13 = local_a0;
        uVar14 = local_54;
        iVar7 = local_58;
      }
      uVar8 = local_d8;
      for (ip_00 = (int *)((long)local_b8 + local_90); local_d8 = uVar8, ip = ip_00,
          ip_00 <= local_60; ip_00 = (int *)((long)ip_00 + sVar9 + 4)) {
        iVar11 = (int)ip_00 - (int)local_b0;
        UVar3 = (ms->window).lowLimit;
        UVar15 = iVar11 - uVar14;
        if (iVar11 - UVar3 <= uVar14) {
          UVar15 = UVar3;
        }
        if (ms->loadedDictEnd != 0) {
          UVar15 = UVar3;
        }
        uVar8 = iVar11 - local_d8;
        pBVar10 = local_b0;
        if (uVar8 < (uint)local_98) {
          pBVar10 = local_70;
        }
        if (((iVar7 - uVar8 < 3) || (iVar11 - UVar15 < local_d8)) ||
           (*ip_00 != *(int *)(pBVar10 + uVar8))) break;
        piVar13 = iEnd;
        if (uVar8 < (uint)local_98) {
          piVar13 = local_50;
        }
        sVar9 = ZSTD_count_2segments
                          ((BYTE *)(ip_00 + 1),(BYTE *)((long)(pBVar10 + uVar8) + 4),(BYTE *)iEnd,
                           (BYTE *)piVar13,local_80);
        if (local_c8->maxNbSeq <=
            (ulong)((long)local_c8->sequences - (long)local_c8->sequencesStart >> 3))
        goto LAB_0018c50e;
        if (0x20000 < local_c8->maxNbLit) goto LAB_0018c56b;
        pBVar10 = local_c8->lit;
        if (local_c8->litStart + local_c8->maxNbLit < pBVar10) goto LAB_0018c58a;
        if (iEnd < ip_00) goto LAB_0018c54c;
        if (local_a0 < ip_00) {
          ZSTD_safecopyLiterals(pBVar10,(BYTE *)ip_00,(BYTE *)ip_00,(BYTE *)local_a0);
        }
        else {
          uVar6 = *(undefined8 *)(ip_00 + 2);
          *(undefined8 *)pBVar10 = *(undefined8 *)ip_00;
          *(undefined8 *)(pBVar10 + 8) = uVar6;
        }
        psVar5 = local_c8->sequences;
        psVar5->litLength = 0;
        psVar5->offBase = 1;
        if (sVar9 + 4 < 3) goto LAB_0018c52d;
        if (0xffff < sVar9 + 1) {
          if (local_c8->longLengthType != ZSTD_llt_none) goto LAB_0018c5a9;
          local_c8->longLengthType = ZSTD_llt_matchLength;
          local_c8->longLengthPos =
               (U32)((ulong)((long)psVar5 - (long)local_c8->sequencesStart) >> 3);
        }
        psVar5->mlBase = (U16)(sVar9 + 1);
        local_c8->sequences = psVar5 + 1;
        piVar13 = local_a0;
        uVar8 = local_d4;
        local_d4 = local_d8;
      }
      goto LAB_0018bdaa;
    }
LAB_0018be13:
    ofbCandidate = 999999999;
    if (local_a4 == 6) {
      if (local_c0 == 6) {
        uVar18 = ZSTD_RowFindBestMatch_extDict_6_6(ms,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
      }
      else if (local_c0 == 5) {
        uVar18 = ZSTD_RowFindBestMatch_extDict_6_5(ms,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
      }
      else {
        uVar18 = ZSTD_RowFindBestMatch_extDict_6_4(ms,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
      }
    }
    else if (local_a4 == 5) {
      if (local_c0 == 6) {
        uVar18 = ZSTD_RowFindBestMatch_extDict_5_6(ms,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
      }
      else if (local_c0 == 5) {
        uVar18 = ZSTD_RowFindBestMatch_extDict_5_5(ms,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
      }
      else {
        uVar18 = ZSTD_RowFindBestMatch_extDict_5_4(ms,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
      }
    }
    else if (local_c0 == 6) {
      uVar18 = ZSTD_RowFindBestMatch_extDict_4_6(ms,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
    }
    else if (local_c0 == 5) {
      uVar18 = ZSTD_RowFindBestMatch_extDict_4_5(ms,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
    }
    else {
      uVar18 = ZSTD_RowFindBestMatch_extDict_4_4(ms,(BYTE *)ip_00,(BYTE *)iEnd,&ofbCandidate);
    }
    if (3 < uVar18) {
      sVar9 = ofbCandidate;
      if (3 < ofbCandidate) {
        uVar16 = (long)ip_00 + (-(long)local_b0 - ofbCandidate) + 3;
        pBVar12 = local_80;
        pBVar10 = local_b0;
        if ((uint)uVar16 < (uint)local_98) {
          pBVar12 = local_40;
          pBVar10 = local_70;
        }
        pBVar10 = pBVar10 + (uVar16 & 0xffffffff);
        for (; ((ip < ip_00 && (pBVar12 < pBVar10)) && (*(BYTE *)((long)ip_00 + -1) == pBVar10[-1]))
            ; ip_00 = (int *)((long)ip_00 + -1)) {
          pBVar10 = pBVar10 + -1;
          uVar18 = uVar18 + 1;
        }
        local_d8 = local_d4;
        local_d4 = (int)ofbCandidate - 3;
      }
      goto LAB_0018bfe2;
    }
    uVar18 = (long)ip_00 - (long)ip;
    ip_00 = (int *)((long)ip_00 + (uVar18 >> 8) + 1);
    ms->lazySkipping = (uint)(0x8ff < uVar18);
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_greedy_extDict_row(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_rowHash, 0);
}